

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CGL::Application::render(Application *this)

{
  Mode MVar1;
  Application *this_00;
  
  this_00 = this;
  update_gl_camera(this);
  MVar1 = this->mode;
  if (MVar1 == VISUALIZE_MODE) {
    if (this->show_coordinates == true) {
      draw_coordinates(this_00);
    }
  }
  else if (MVar1 != RENDER_MODE) {
    if (MVar1 == EDIT_MODE) {
      if (this->show_coordinates == true) {
        draw_coordinates(this_00);
      }
      GLScene::Scene::render_in_opengl(this->scene);
      if (this->show_hud == true) {
        draw_hud(this);
      }
    }
    goto LAB_001340ec;
  }
  (*this->renderer->_vptr_OfflineRenderer[5])();
LAB_001340ec:
  VisualDebugger::render(this->debugger);
  return;
}

Assistant:

void Application::render() {
  update_gl_camera();
  switch (mode) {
    case EDIT_MODE:
      if (show_coordinates) draw_coordinates();
      scene->render_in_opengl();
      if (show_hud) draw_hud();
      break;
    case VISUALIZE_MODE:
      if (show_coordinates) draw_coordinates();
    case RENDER_MODE:
      renderer->update_screen();
      break;
  }

  debugger->render();
}